

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onconnect.c
# Opt level: O1

int accept_client(void)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  socklen_t sz;
  sockaddr_in in;
  sigset_t none;
  socklen_t local_ac;
  sockaddr local_a8;
  sigset_t local_98;
  
  local_ac = 0x10;
  iVar1 = accept(cfg.listener_fd,&local_a8,&local_ac);
  if (iVar1 == -1) {
    accept_client_cold_5();
  }
  else {
    if ((cfg.verbose != 0) && (local_ac == 0x10)) {
      accept_client_cold_1();
    }
    uVar2 = fork();
    if (uVar2 == 0xffffffff) {
      accept_client_cold_4();
    }
    else {
      if (0 < (int)uVar2) {
        close(iVar1);
        fprintf(_stderr,"forked pid %d\n",(ulong)uVar2);
        return 0;
      }
      if (uVar2 != 0) {
        __assert_fail("pid == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/troydhanson[P]pmtr/src/onconnect.c"
                      ,0x9f,"int accept_client()");
      }
      close(cfg.listener_fd);
      close(cfg.signal_fd);
      close(cfg.epoll_fd);
      if (iVar1 != 3) {
        iVar3 = dup2(iVar1,3);
        if (iVar3 < 0) {
          accept_client_cold_2();
          return -1;
        }
        close(iVar1);
      }
      lVar4 = 0;
      do {
        signal(*(int *)((long)sigs + lVar4),(__sighandler_t)0x0);
        lVar4 = lVar4 + 4;
      } while (lVar4 != 0x1c);
      sigemptyset(&local_98);
      sigprocmask(2,&local_98,(sigset_t *)0x0);
      iVar1 = execv(*cfg.subprocess_argv,cfg.subprocess_argv);
      if (iVar1 != -1) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/troydhanson[P]pmtr/src/onconnect.c"
                      ,0xc0,"int accept_client()");
      }
      accept_client_cold_3();
    }
  }
  return -1;
}

Assistant:

int accept_client() {
  int fd, n, sc, rc = -1;
  pid_t pid;
  struct sockaddr_in in;
  socklen_t sz = sizeof(in);

  fd = accept(cfg.listener_fd,(struct sockaddr*)&in, &sz);
  if (fd == -1) {
    fprintf(stderr,"accept: %s\n", strerror(errno)); 
    goto done;
  }

  if (cfg.verbose && (sizeof(in)==sz)) {
    fprintf(stderr,"connection fd %d from %s:%d\n", fd,
    inet_ntoa(in.sin_addr), (int)ntohs(in.sin_port));
  }

  /* fork subprocess */
  pid = fork();

  if (pid == -1) {
    fprintf(stderr, "fork: %s\n", strerror(errno));
    goto done;
  }

  if (pid > 0) { /* parent */
    close(fd);
    fprintf(stderr, "forked pid %d\n", pid);
  } else {  /* child */
    assert(pid == 0);

    /* in the child, close the parent's descriptors except
     * for stdin, stdout, stderr and the new connection */
    close(cfg.listener_fd);
    close(cfg.signal_fd);
    close(cfg.epoll_fd);

    /* make the new connection fd 3, close original fd */
    if (fd != STDERR_FILENO+1) {      /* 3 */
      sc = dup2(fd, STDERR_FILENO+1);
      if (sc < 0) {
        fprintf(stderr, "dup2: %s\n", strerror(errno));
        goto done;
      }
      close(fd);
    }

    /* restore/unblock default signal handlers */
    for(n = 0; n < sizeof(sigs)/sizeof(*sigs); n++) {
      signal(sigs[n], SIG_DFL);
    }
    sigset_t none;
    sigemptyset(&none);
    sigprocmask(SIG_SETMASK, &none, NULL);

    sc = execv(cfg.subprocess_argv[0], cfg.subprocess_argv);
    if (sc == -1) {
      fprintf(stderr, "execv: %s\n", strerror(errno));
      goto done;
    }

    /* NOT REACHED */
    assert(0);
    goto done;

  }

  rc = 0;

 done:
  return rc;
}